

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O3

void RangeEnc_FlushStream(CRangeEnc *p)

{
  size_t sVar1;
  size_t sVar2;
  
  if (p->res != 0) {
    return;
  }
  sVar2 = (long)p->buf - (long)p->bufBase;
  sVar1 = (*p->outStream->Write)(p->outStream,p->bufBase,sVar2);
  if (sVar2 != sVar1) {
    p->res = 9;
  }
  p->processed = p->processed + sVar2;
  p->buf = p->bufBase;
  return;
}

Assistant:

static void RangeEnc_FlushStream(CRangeEnc *p)
{
  size_t num;
  if (p->res != SZ_OK)
    return;
  num = p->buf - p->bufBase;
  if (num != p->outStream->Write(p->outStream, p->bufBase, num))
    p->res = SZ_ERROR_WRITE;
  p->processed += num;
  p->buf = p->bufBase;
}